

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

Function __thiscall
mp::BasicExprFactory<std::allocator<char>_>::DefineFunction
          (BasicExprFactory<std::allocator<char>_> *this,int index,StringRef name,int num_args,
          Type type)

{
  pointer ppIVar1;
  Function FVar2;
  Error *this_00;
  
  ppIVar1 = (this->funcs_).
            super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar1[index] == (Impl *)0x0) {
    FVar2 = CreateFunction(this,ppIVar1 + index,name,num_args,type);
    return (Function)FVar2.impl_;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x18);
  Error::Error(this_00,(CStringRef)0x2c020f,index);
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

Function DefineFunction(int index, fmt::StringRef name,
                          int num_args, func::Type type) {
    internal::CheckIndex(index, funcs_.size());
    const Function::Impl *&impl = funcs_[index];
    if (impl)
      throw Error("function {} is already defined", index);
    return CreateFunction(impl, name, num_args, type);
  }